

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.cpp
# Opt level: O1

void __thiscall Kumu::XMLElement::DeleteAttrWithName(XMLElement *this,char *name)

{
  _List_node_base *__n;
  XMLElement *pXVar1;
  int iVar2;
  size_t sVar3;
  iterator __position;
  bool bVar4;
  long *local_50;
  _List_node_base *local_48;
  long local_40 [2];
  
  if (name != (char *)0x0) {
    __position._M_node =
         (this->m_AttrList).super__List_base<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>._M_impl.
         _M_node.super__List_node_base._M_next;
    if ((XMLElement *)__position._M_node != this) {
      do {
        local_50 = local_40;
        sVar3 = strlen(name);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar3);
        __n = __position._M_node[1]._M_prev;
        if (__n == local_48) {
          if (__n == (_List_node_base *)0x0) {
            bVar4 = true;
          }
          else {
            iVar2 = bcmp(__position._M_node[1]._M_next,local_50,(size_t)__n);
            bVar4 = iVar2 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        pXVar1 = (XMLElement *)(__position._M_node)->_M_next;
        if (bVar4) {
          std::__cxx11::list<Kumu::NVPair,_std::allocator<Kumu::NVPair>_>::_M_erase
                    (&this->m_AttrList,__position);
        }
        __position._M_node = (_List_node_base *)pXVar1;
      } while (pXVar1 != this);
    }
    return;
  }
  __assert_fail("name",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_xml.cpp"
                ,0x14b,"void Kumu::XMLElement::DeleteAttrWithName(const char *)");
}

Assistant:

void
Kumu::XMLElement::DeleteAttrWithName(const char* name)
{
  assert(name);
  AttributeList::iterator i = m_AttrList.begin();

  while ( i != m_AttrList.end() )
    {
      if ( i->name == std::string(name) )
	m_AttrList.erase(i++);
      else
	++i;
    }
}